

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

ArchType parseArch(StringRef ArchName)

{
  ISAKind IVar1;
  EndianKind EVar2;
  ArchType AVar3;
  ProfileKind PVar4;
  uint uVar5;
  undefined *puVar6;
  ulong in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ARM *this;
  StringRef SVar7;
  StringRef Arch;
  StringRef Arch_00;
  
  SVar7.Data = (char *)ArchName.Length;
  this = (ARM *)ArchName.Data;
  switch(SVar7.Data) {
  case (char *)0x3:
    if (this[2] == (ARM)0x63 && *(short *)this == 0x7070) {
      return ppc;
    }
    if (this[2] == (ARM)0x75 && *(short *)this == 0x7070) {
      return ppc64;
    }
    if (this[2] == (ARM)0x63 && *(short *)this == 0x7261) {
      return arc;
    }
    if (this[2] == (ARM)0x6d && *(short *)this == 0x7261) {
      return arm;
    }
    if (this[2] == (ARM)0x72 && *(short *)this == 0x7661) {
      return avr;
    }
    if (this[2] == (ARM)0x65 && *(short *)this == 0x6374) {
      return tce;
    }
    break;
  case (char *)0x4:
    if (*(int *)this == 0x36383369) {
      return x86;
    }
    if (*(int *)this == 0x36383469) {
      return x86;
    }
    if (*(int *)this == 0x36383569) {
      return x86;
    }
    if (*(int *)this == 0x36383669) {
      return x86;
    }
    if (*(int *)this == 0x36383769) {
      return x86;
    }
    if (*(int *)this == 0x36383869) {
      return x86;
    }
    if (*(int *)this == 0x36383969) {
      return x86;
    }
    if (*(int *)this == 0x7370696d) {
      return mips;
    }
    if (*(int *)this == 0x30303672) {
      return r600;
    }
    if (*(int *)this == 0x3233656c) {
      return le32;
    }
    if (*(int *)this == 0x3436656c) {
      return le64;
    }
    if (*(int *)this == 0x72697073) {
      return spir;
    }
    break;
  case (char *)0x5:
    if (this[4] == (ARM)0x34 && *(int *)this == 0x36646d61) {
      return x86_64;
    }
    if (this[4] == (ARM)0x32 && *(int *)this == 0x33637070) {
      return ppc;
    }
    if (this[4] == (ARM)0x34 && *(int *)this == 0x36637070) {
      return ppc64;
    }
    if (this[4] == (ARM)0x34 && *(int *)this == 0x366d7261) {
      return aarch64;
    }
    if (this[4] == (ARM)0x62 && *(int *)this == 0x656d7261) {
      return armeb;
    }
    if (this[4] == (ARM)0x62 && *(int *)this == 0x6d756874) {
      return thumb;
    }
    if (this[4] == (ARM)0x32 && *(int *)this == 0x736f696e) {
      return nios2;
    }
    if (this[4] == (ARM)0x78 && *(int *)this == 0x30393373) {
      return systemz;
    }
    if (this[4] == (ARM)0x63 && *(int *)this == 0x72617073) {
      return sparc;
    }
    if (this[4] == (ARM)0x65 && *(int *)this == 0x6c656374) {
      return tcele;
    }
    if (this[4] == (ARM)0x65 && *(int *)this == 0x726f6378) {
      return xcore;
    }
    if (this[4] == (ARM)0x78 && *(int *)this == 0x7470766e) {
      return nvptx;
    }
    if (this[4] == (ARM)0x6c && *(int *)this == 0x69646d61) {
      return amdil;
    }
    if (this[4] == (ARM)0x6c && *(int *)this == 0x69617368) {
      return hsail;
    }
    if (this[4] == (ARM)0x69 && *(int *)this == 0x616e616c) {
      return lanai;
    }
    if (this[4] == (ARM)0x65 && *(int *)this == 0x76616873) {
      return shave;
    }
    break;
  case (char *)0x6:
    if (*(short *)(this + 4) == 0x3436 && *(int *)this == 0x5f363878) {
      return x86_64;
    }
    if (*(short *)(this + 4) == 0x656c && *(int *)this == 0x61637378) {
      return arm;
    }
    if (*(short *)(this + 4) == 0x3033 && *(int *)this == 0x3470736d) {
      return msp430;
    }
    if (*(short *)(this + 4) == 0x6265 && *(int *)this == 0x7370696d) {
      return mips;
    }
    if (*(short *)(this + 4) == 0x6c65 && *(int *)this == 0x7370696d) {
      return mipsel;
    }
    if (*(short *)(this + 4) == 0x3436 && *(int *)this == 0x7370696d) {
      return mips64;
    }
    if (*(short *)(this + 4) == 0x6e63 && *(int *)this == 0x67646d61) {
      return amdgcn;
    }
    if (*(short *)(this + 4) == 0x3436 && *(int *)this == 0x72697073) {
      return spir64;
    }
    uVar5 = *(ushort *)(this + 4) ^ 0x3233 | *(uint *)this ^ 0x6d736177;
    in_RDX = (ulong)uVar5;
    if (uVar5 == 0) {
      return wasm32;
    }
    if (*(short *)(this + 4) == 0x3436 && *(int *)this == 0x6d736177) {
      return wasm64;
    }
    break;
  case (char *)0x7:
    if (*(int *)(this + 3) == 0x6834365f && *(int *)this == 0x5f363878) {
      return x86_64;
    }
    if (*(int *)(this + 3) == 0x63707265 && *(int *)this == 0x65776f70) {
      return ppc;
    }
    if (*(int *)(this + 3) == 0x656c3436 && *(int *)this == 0x36637070) {
      return ppc64le;
    }
    if (*(int *)(this + 3) == 0x34366863 && *(int *)this == 0x63726161) {
      return aarch64;
    }
    if (*(int *)(this + 3) == 0x6265626d && *(int *)this == 0x6d756874) {
      return thumbeb;
    }
    if (*(int *)(this + 3) == 0x32337663 && *(int *)this == 0x63736972) {
      return riscv32;
    }
    if (*(int *)(this + 3) == 0x34367663 && *(int *)this == 0x63736972) {
      return riscv64;
    }
    if (*(int *)(this + 3) == 0x6e6f6761 && *(int *)this == 0x61786568) {
      return hexagon;
    }
    if (*(int *)(this + 3) == 0x7a6d6574 && *(int *)this == 0x74737973) {
      return systemz;
    }
    if (*(int *)(this + 3) == 0x6c656372 && *(int *)this == 0x72617073) {
      return sparcel;
    }
    if (*(int *)(this + 3) == 0x39766372 && *(int *)this == 0x72617073) {
      return sparcv9;
    }
    if (*(int *)(this + 3) == 0x34366372 && *(int *)this == 0x72617073) {
      return sparcv9;
    }
    if (*(int *)(this + 3) == 0x34367874 && *(int *)this == 0x7470766e) {
      return nvptx64;
    }
    uVar5 = *(uint *)(this + 3) ^ 0x34366c69 | *(uint *)this ^ 0x69646d61;
    in_RDX = (ulong)uVar5;
    if (uVar5 == 0) {
      return amdil64;
    }
    if (*(int *)(this + 3) == 0x34366c69 && *(int *)this == 0x69617368) {
      return hsail64;
    }
    goto LAB_0015c61c;
  case (char *)0x8:
    if (*(long *)this == 0x6265656c61637378) {
      return armeb;
    }
    if (*(long *)this == 0x626534367370696d) {
      return mips64;
    }
    if (*(long *)this == 0x6c6534367370696d) {
      return mips64el;
    }
LAB_0015c61c:
    if (*(int *)(this + 3) == 0x61626d69 && *(int *)this == 0x696c616b) {
      return kalimba;
    }
    break;
  case (char *)0x9:
    if (this[8] == (ARM)0x34 && *(long *)this == 0x3663707265776f70) {
      return ppc64;
    }
    goto LAB_0015ca37;
  case (char *)0xa:
    if (*(short *)(this + 8) == 0x6562 && *(long *)this == 0x5f34366863726161) {
      return aarch64_be;
    }
    goto LAB_0015ca37;
  case (char *)0xb:
    if (*(long *)(this + 3) == 0x656c343663707265 && *(long *)this == 0x3663707265776f70) {
      return ppc64le;
    }
    goto LAB_0015ca37;
  case (char *)0xc:
    if (*(int *)(this + 8) == 0x78657267 && *(long *)this == 0x656c6c617370696d) {
      return mips;
    }
    goto LAB_0015ca37;
  default:
    if (SVar7.Data < (char *)0x7) {
      return UnknownArch;
    }
LAB_0015ca37:
    if (*(int *)(this + 3) == 0x61626d69 && *(int *)this == 0x696c616b) {
      return kalimba;
    }
    if (SVar7.Data == (char *)0xe) {
LAB_0015ca56:
      in_RDX = *(ulong *)(this + 6) ^ 0x3233747069726373 | *(ulong *)this ^ 0x63737265646e6572;
      if (in_RDX == 0) {
        return renderscript32;
      }
      if (*(long *)(this + 6) == 0x3436747069726373 && *(long *)this == 0x63737265646e6572) {
        return LastArchType;
      }
    }
    break;
  case (char *)0xe:
    if (*(long *)(this + 6) == 0x6c6578657267656c && *(long *)this == 0x656c6c617370696d) {
      return mipsel;
    }
    if (*(int *)(this + 3) == 0x61626d69 && *(int *)this == 0x696c616b) {
      return kalimba;
    }
    goto LAB_0015ca56;
  }
  if ((this[2] != (ARM)0x6d || *(short *)this != 0x7261) &&
     ((SVar7.Data < (char *)0x5 ||
      ((this[4] != (ARM)0x62 || *(int *)this != 0x6d756874 &&
       ((SVar7.Data < (char *)0x7 ||
        (*(int *)(this + 3) != 0x34366863 || *(int *)this != 0x63726161)))))))) {
    if (this[2] != (ARM)0x66 || *(short *)this != 0x7062) {
      return UnknownArch;
    }
    AVar3 = parseBPFArch(ArchName);
    return AVar3;
  }
  SVar7.Length = in_RDX;
  IVar1 = llvm::ARM::parseArchISA(this,SVar7);
  Arch.Length = extraout_RDX;
  Arch.Data = SVar7.Data;
  EVar2 = llvm::ARM::parseArchEndian(this,Arch);
  if (EVar2 == BIG) {
    AVar3 = UnknownArch;
    if (2 < IVar1 - ARM) goto LAB_0015cbb1;
    puVar6 = &DAT_001e7e38;
  }
  else {
    AVar3 = UnknownArch;
    if ((EVar2 != LITTLE) || (AVar3 = UnknownArch, 2 < IVar1 - ARM)) goto LAB_0015cbb1;
    puVar6 = &DAT_001e7e2c;
  }
  AVar3 = *(ArchType *)(puVar6 + (ulong)(IVar1 - ARM) * 4);
LAB_0015cbb1:
  Arch_00.Length = extraout_RDX_00;
  Arch_00.Data = SVar7.Data;
  SVar7 = llvm::ARM::getCanonicalArchName(this,Arch_00);
  if (SVar7.Length == 0) {
    return UnknownArch;
  }
  if (SVar7.Length != 1 && IVar1 == THUMB) {
    if (*(short *)SVar7.Data == 0x3276) {
      return UnknownArch;
    }
    if (*(short *)SVar7.Data == 0x3376) {
      return UnknownArch;
    }
  }
  PVar4 = llvm::ARM::parseArchProfile(SVar7);
  uVar5 = llvm::ARM::parseArchVersion(SVar7);
  if (uVar5 == 6 && PVar4 == M) {
    return (EVar2 == BIG) + thumb;
  }
  return AVar3;
}

Assistant:

static Triple::ArchType parseArch(StringRef ArchName) {
  auto AT = StringSwitch<Triple::ArchType>(ArchName)
    .Cases("i386", "i486", "i586", "i686", Triple::x86)
    // FIXME: Do we need to support these?
    .Cases("i786", "i886", "i986", Triple::x86)
    .Cases("amd64", "x86_64", "x86_64h", Triple::x86_64)
    .Cases("powerpc", "ppc", "ppc32", Triple::ppc)
    .Cases("powerpc64", "ppu", "ppc64", Triple::ppc64)
    .Cases("powerpc64le", "ppc64le", Triple::ppc64le)
    .Case("xscale", Triple::arm)
    .Case("xscaleeb", Triple::armeb)
    .Case("aarch64", Triple::aarch64)
    .Case("aarch64_be", Triple::aarch64_be)
    .Case("arc", Triple::arc)
    .Case("arm64", Triple::aarch64)
    .Case("arm", Triple::arm)
    .Case("armeb", Triple::armeb)
    .Case("thumb", Triple::thumb)
    .Case("thumbeb", Triple::thumbeb)
    .Case("avr", Triple::avr)
    .Case("msp430", Triple::msp430)
    .Cases("mips", "mipseb", "mipsallegrex", Triple::mips)
    .Cases("mipsel", "mipsallegrexel", Triple::mipsel)
    .Cases("mips64", "mips64eb", Triple::mips64)
    .Case("mips64el", Triple::mips64el)
    .Case("nios2", Triple::nios2)
    .Case("r600", Triple::r600)
    .Case("amdgcn", Triple::amdgcn)
    .Case("riscv32", Triple::riscv32)
    .Case("riscv64", Triple::riscv64)
    .Case("hexagon", Triple::hexagon)
    .Cases("s390x", "systemz", Triple::systemz)
    .Case("sparc", Triple::sparc)
    .Case("sparcel", Triple::sparcel)
    .Cases("sparcv9", "sparc64", Triple::sparcv9)
    .Case("tce", Triple::tce)
    .Case("tcele", Triple::tcele)
    .Case("xcore", Triple::xcore)
    .Case("nvptx", Triple::nvptx)
    .Case("nvptx64", Triple::nvptx64)
    .Case("le32", Triple::le32)
    .Case("le64", Triple::le64)
    .Case("amdil", Triple::amdil)
    .Case("amdil64", Triple::amdil64)
    .Case("hsail", Triple::hsail)
    .Case("hsail64", Triple::hsail64)
    .Case("spir", Triple::spir)
    .Case("spir64", Triple::spir64)
    .StartsWith("kalimba", Triple::kalimba)
    .Case("lanai", Triple::lanai)
    .Case("shave", Triple::shave)
    .Case("wasm32", Triple::wasm32)
    .Case("wasm64", Triple::wasm64)
    .Case("renderscript32", Triple::renderscript32)
    .Case("renderscript64", Triple::renderscript64)
    .Default(Triple::UnknownArch);

  // Some architectures require special parsing logic just to compute the
  // ArchType result.
  if (AT == Triple::UnknownArch) {
    if (ArchName.startswith("arm") || ArchName.startswith("thumb") ||
        ArchName.startswith("aarch64"))
      return parseARMArch(ArchName);
    if (ArchName.startswith("bpf"))
      return parseBPFArch(ArchName);
  }

  return AT;
}